

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O1

void __thiscall
tsl::detail_robin_hash::
robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::rehash_impl(robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *this,size_type count_)

{
  short sVar1;
  pointer pbVar2;
  undefined8 uVar3;
  bucket_entry<unsigned_long,_false> *bucket;
  pointer pbVar4;
  ulong uVar5;
  short sVar6;
  bucket_entry *pbVar7;
  unsigned_long __tmp;
  robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  new_table;
  allocator<unsigned_long> local_59;
  robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  local_58;
  
  robin_hash(&local_58,count_,(hash<unsigned_long> *)this,(equal_to<unsigned_long> *)this,&local_59,
             this->m_min_load_factor,this->m_max_load_factor);
  pbVar4 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<unsigned_long,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<unsigned_long,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<unsigned_long,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<unsigned_long,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
joined_r0x0016ed46:
  if (pbVar4 == pbVar2) {
    local_58.m_nb_elements = this->m_nb_elements;
    swap(&local_58,this);
    std::
    vector<tsl::detail_robin_hash::bucket_entry<unsigned_long,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<unsigned_long,_false>_>_>
    ::~vector(&local_58.m_buckets_data);
    return;
  }
  if (pbVar4->m_dist_from_ideal_bucket != -1) {
    uVar5 = *(ulong *)pbVar4->m_value;
    sVar6 = 0;
    do {
      uVar5 = local_58.super_power_of_two_growth_policy<2UL>.m_mask & uVar5;
      sVar1 = local_58.m_buckets[uVar5].m_dist_from_ideal_bucket;
      if (sVar1 < sVar6) {
        pbVar7 = local_58.m_buckets + uVar5;
        uVar3 = *(undefined8 *)pbVar4->m_value;
        if (sVar1 == -1) goto LAB_0016eda3;
        *(undefined8 *)pbVar4->m_value = *(undefined8 *)pbVar7->m_value;
        *(undefined8 *)pbVar7->m_value = uVar3;
        pbVar7->m_dist_from_ideal_bucket = sVar6;
        sVar6 = sVar1;
      }
      sVar6 = sVar6 + 1;
      uVar5 = uVar5 + 1;
    } while( true );
  }
  goto LAB_0016edab;
LAB_0016eda3:
  *(undefined8 *)pbVar7->m_value = uVar3;
  pbVar7->m_dist_from_ideal_bucket = sVar6;
LAB_0016edab:
  pbVar4 = pbVar4 + 1;
  goto joined_r0x0016ed46;
}

Assistant:

void rehash_impl(size_type count_) {
    robin_hash new_table(count_, static_cast<Hash&>(*this),
                         static_cast<KeyEqual&>(*this), get_allocator(),
                         m_min_load_factor, m_max_load_factor);
    tsl_rh_assert(size() <= new_table.m_load_threshold);

    const bool use_stored_hash =
        USE_STORED_HASH_ON_REHASH(new_table.bucket_count());
    for (auto& bucket : m_buckets_data) {
      if (bucket.empty()) {
        continue;
      }

      const std::size_t hash =
          use_stored_hash ? bucket.truncated_hash()
                          : new_table.hash_key(KeySelect()(bucket.value()));

      new_table.insert_value_on_rehash(new_table.bucket_for_hash(hash), 0,
                                       bucket_entry::truncate_hash(hash),
                                       std::move(bucket.value()));
    }

    new_table.m_nb_elements = m_nb_elements;
    new_table.swap(*this);
  }